

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seastest.c
# Opt level: O0

void mstl(double *x,int N,int *f,int *Nseas,int *s_window,double *lambda,int *iterate,
         double **seasonal,double *trend,double *remainder)

{
  double dVar1;
  int iVar2;
  double *y_00;
  double *v;
  int *pos_00;
  void *__ptr;
  double *pdVar3;
  int local_90;
  int local_8c;
  int *pos;
  double *seas;
  double *msts;
  double *deseas;
  double *t;
  double *y;
  int freq;
  int iter;
  int iterate_;
  int Niter;
  int s_window_;
  int k;
  int j;
  int i;
  double *lambda_local;
  int *s_window_local;
  int *Nseas_local;
  int *f_local;
  double *pdStack_10;
  int N_local;
  double *x_local;
  
  iter = 0;
  if (s_window == (int *)0x0) {
    local_8c = 0xd;
  }
  else {
    local_8c = *s_window;
  }
  iterate_ = local_8c;
  if (iterate == (int *)0x0) {
    local_90 = 2;
  }
  else {
    local_90 = *iterate;
  }
  _j = lambda;
  lambda_local = (double *)s_window;
  s_window_local = Nseas;
  Nseas_local = f;
  f_local._4_4_ = N;
  pdStack_10 = x;
  y_00 = (double *)malloc((long)N << 3);
  if (_j == (double *)0x0) {
    memcpy(y_00,pdStack_10,(long)f_local._4_4_ << 3);
  }
  else {
    boxcox(pdStack_10,f_local._4_4_,_j,y_00);
  }
  v = (double *)malloc((long)*s_window_local << 3);
  for (k = 0; k < *s_window_local; k = k + 1) {
    if (Nseas_local[k] < f_local._4_4_ / 2) {
      v[iter] = (double)Nseas_local[k];
      iter = iter + 1;
    }
  }
  pos_00 = (int *)malloc((long)iter << 2);
  sort1d_ascending(v,iter,pos_00);
  if (iter < 1) {
    pdVar3 = (double *)malloc((long)f_local._4_4_ << 3);
    for (k = 0; k < f_local._4_4_; k = k + 1) {
      pdVar3[k] = (double)k;
    }
    supsmu(pdVar3,f_local._4_4_,y_00,(double *)0x0,1,0.0,-1.0,trend);
    for (k = 0; k < f_local._4_4_; k = k + 1) {
      remainder[k] = y_00[k] - trend[k];
    }
    *s_window_local = 0;
    free(pdVar3);
  }
  else {
    __ptr = calloc((long)(iter * f_local._4_4_),8);
    pdVar3 = (double *)calloc((long)f_local._4_4_,8);
    memcpy(pdVar3,y_00,(long)f_local._4_4_ << 3);
    for (s_window_ = 0; s_window_ < local_90; s_window_ = s_window_ + 1) {
      for (k = 0; k < iter; k = k + 1) {
        iVar2 = k * f_local._4_4_;
        for (Niter = 0; Niter < f_local._4_4_; Niter = Niter + 1) {
          pdVar3[Niter] = *(double *)((long)__ptr + (long)(iVar2 + Niter) * 8) + pdVar3[Niter];
        }
        dVar1 = v[k];
        stl(pdVar3,f_local._4_4_,(int)dVar1,"null",&iterate_,(int *)0x0,(int *)0x0,(int *)0x0,
            (int *)0x0,(int *)0x0,(int *)0x0,(int *)0x0,(int *)0x0,(int *)0x0,(int *)0x0,(int *)0x0,
            (double *)((long)__ptr + (long)iVar2 * 8),trend,remainder);
        for (Niter = 0; Niter < f_local._4_4_; Niter = Niter + 1) {
          pdVar3[Niter] = pdVar3[Niter] - *(double *)((long)__ptr + (long)(iVar2 + Niter) * 8);
        }
        Nseas_local[k] = (int)dVar1;
      }
    }
    for (k = 0; k < f_local._4_4_; k = k + 1) {
      remainder[k] = pdVar3[k] - trend[k];
    }
    for (k = 0; k < iter; k = k + 1) {
      for (s_window_ = 0; s_window_ < f_local._4_4_; s_window_ = s_window_ + 1) {
        seasonal[k][s_window_] =
             *(double *)((long)__ptr + (long)(k * f_local._4_4_ + s_window_) * 8);
      }
    }
    *s_window_local = iter;
    free(__ptr);
    free(pdVar3);
  }
  free(y_00);
  free(pos_00);
  free(v);
  return;
}

Assistant:

void mstl(double *x, int N, int *f, int *Nseas, int *s_window,double *lambda,int *iterate, double **seasonal, double *trend,double *remainder) {
    int i,j,k,s_window_,Niter,iterate_,iter,freq;
    double *y,*t,*deseas;
    double *msts,*seas;
    int *pos;

    Niter = 0;

    s_window_ = (s_window == NULL) ? 13 : *s_window;
    iterate_ = (iterate == NULL) ? 2 : *iterate;

    y = (double*)malloc(sizeof(double)*N);

    if (lambda != NULL) {
        boxcox(x,N,lambda,y);
    } else {
        memcpy(y,x,sizeof(double)*N);
    }

    msts = (double*)malloc(sizeof(double)*(*Nseas));

    for(i = 0; i < *Nseas;++i) {
        if (f[i] < N / 2) {
            msts[Niter] = (double) f[i];
            Niter++;
        }
    }

    pos = (int*)malloc(sizeof(int)*Niter);

    sort1d_ascending(msts,Niter,pos);

    if (Niter > 0) {

        seas = (double*)calloc(Niter*N,sizeof(double));
        deseas = (double*)calloc(N,sizeof(double));

        memcpy(deseas,y,sizeof(double)*N);

        for(j = 0; j < iterate_;++j) {
            for(i = 0; i < Niter;++i) {
                iter = i * N;
                for(k = 0; k < N;++k) {
                    deseas[k] += seas[iter+k];
                }
                freq = (int) msts[i];
                stl(deseas,N,freq,"null",&s_window_,NULL,NULL,NULL,NULL,NULL,NULL,NULL,NULL,NULL,NULL,NULL,seas+iter,trend,remainder);
                for(k = 0; k < N;++k) {
                    deseas[k] -= seas[iter+k];
                }
                f[i] = freq;
            }
        }

        for(i = 0; i < N;++i) {
            remainder[i] = deseas[i] - trend[i];
        }
        for(i = 0; i < Niter;++i) {
            iter = i * N;
            for(j = 0; j < N;++j) {
                seasonal[i][j] = seas[iter+j];
            }
        }

        *Nseas = Niter;

        free(seas);
        free(deseas);
    } else {
        t = (double*) malloc(sizeof(double)*N);
        for(i = 0; i < N;++i) {
            t[i] = i;
        }
        supsmu(t,N,y,NULL,1,0,-1.0,trend);
        for(i = 0; i < N;++i) {
            remainder[i] = y[i] - trend[i];
        }
        *Nseas = 0;
        free(t);
    }


    free(y);
    free(pos);
    free(msts);
}